

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int OptNArgs(void)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int local_14;
  int i;
  int dashdash;
  int cnt;
  
  i = 0;
  bVar1 = false;
  if ((argv != (char **)0x0) && (*argv != (char *)0x0)) {
    for (local_14 = 1; argv[local_14] != (char *)0x0; local_14 = local_14 + 1) {
      if ((bVar1) ||
         (((*argv[local_14] != '-' && (*argv[local_14] != '+')) &&
          (pcVar3 = strchr(argv[local_14],0x3d), pcVar3 == (char *)0x0)))) {
        i = i + 1;
      }
      iVar2 = strcmp(argv[local_14],"--");
      if (iVar2 == 0) {
        bVar1 = true;
      }
    }
  }
  return i;
}

Assistant:

int OptNArgs(){
  int cnt = 0;
  int dashdash = 0;
  int i;
  if( argv!=0 && argv[0]!=0 ){
    for(i=1; argv[i]; i++){
      if( dashdash || !ISOPT(argv[i]) ) cnt++;
      if( strcmp(argv[i],"--")==0 ) dashdash = 1;
    }
  }
  return cnt;
}